

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_ssprk.c
# Opt level: O2

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  
  dVar1 = *user_data;
  pdVar3 = (double *)N_VGetArrayPointer();
  dVar2 = *pdVar3;
  dVar4 = atan(t);
  pdVar3 = (double *)N_VGetArrayPointer(ydot);
  *pdVar3 = (dVar2 * dVar1 + 1.0 / (t * t + 1.0)) - dVar4 * dVar1;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype lambda = rdata[0]; /* set shortcut for stiffness parameter */
  sunrealtype u = N_VGetArrayPointer(y)[0]; /* access current solution value */

  /* fill in the RHS function: "N_VGetArrayPointer" accesses the 0th entry of ydot */
  N_VGetArrayPointer(ydot)[0] =
    lambda * u + SUN_RCONST(1.0) / (SUN_RCONST(1.0) + t * t) - lambda * ATAN(t);

  return 0; /* return with success */
}